

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O0

int coda_ascii_cursor_read_bits
              (coda_cursor *cursor,uint8_t *dst,int64_t bit_offset,int64_t bit_length)

{
  int64_t bit_length_local;
  int64_t bit_offset_local;
  uint8_t *dst_local;
  coda_cursor *cursor_local;
  
  if ((bit_length & 7U) == 0) {
    if ((cursor->stack[cursor->n + -1].bit_offset + bit_offset & 7U) == 0) {
      cursor_local._4_4_ =
           read_bytes(cursor->product,cursor->stack[cursor->n + -1].bit_offset + bit_offset >> 3,
                      bit_length >> 3,dst);
    }
    else {
      coda_set_error(-300,"product error detected (ascii text does not start at byte boundary)");
      cursor_local._4_4_ = -1;
    }
  }
  else {
    coda_set_error(-100,"cannot read ascii data using a bitsize that is not a multiple of 8");
    cursor_local._4_4_ = -1;
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_ascii_cursor_read_bits(const coda_cursor *cursor, uint8_t *dst, int64_t bit_offset, int64_t bit_length)
{
    if (bit_length & 0x7)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT,
                       "cannot read ascii data using a bitsize that is not a multiple of 8");
        return -1;
    }
    if ((cursor->stack[cursor->n - 1].bit_offset + bit_offset) & 0x7)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "product error detected (ascii text does not start at byte boundary)");
        return -1;
    }
    return read_bytes(cursor->product, (cursor->stack[cursor->n - 1].bit_offset + bit_offset) >> 3, bit_length >> 3,
                      dst);
}